

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O1

double __thiscall
ProbabEstimator::getProbabGt0
          (ProbabEstimator *this,double minValInRetained,int numReplaced,int pathLength)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  
  dVar7 = DistribFunction::getDistrib(this->distribFunction,minValInRetained);
  dVar8 = 0.0;
  if (numReplaced < pathLength) {
    auVar11 = ZEXT816(0x3ff0000000000000);
    auVar12 = ZEXT816(0) << 0x40;
    do {
      uVar1 = numReplaced + 1;
      uVar4 = pathLength - uVar1;
      auVar10 = ZEXT1664(auVar11);
      if ((double)(int)uVar4 + 0.5 < (double)pathLength) {
        auVar10 = ZEXT1664(auVar11);
        dVar8 = (double)pathLength;
        do {
          auVar10 = ZEXT864((ulong)(dVar8 * auVar10._0_8_));
          dVar8 = dVar8 + -1.0;
        } while ((double)(int)uVar4 + 0.5 < dVar8);
      }
      dVar8 = auVar10._0_8_;
      if (0 < numReplaced) {
        dVar13 = (double)(int)uVar1;
        do {
          dVar8 = auVar10._0_8_ / dVar13;
          auVar10 = ZEXT1664(CONCAT88(auVar10._8_8_,dVar8));
          dVar13 = dVar13 + -1.0;
        } while (1.0 < dVar13);
      }
      auVar5._0_8_ = 1.0;
      uVar3 = uVar1;
      auVar9 = auVar11;
      dVar13 = 1.0 - dVar7;
      if (uVar1 != 0) {
        do {
          auVar5._0_8_ = (double)((ulong)((byte)uVar3 & 1) * (long)(dVar13 * auVar9._0_8_) +
                                 (ulong)!(bool)((byte)uVar3 & 1) * (long)auVar9._0_8_);
          auVar5._8_8_ = auVar9._8_8_;
          bVar2 = 1 < uVar3;
          uVar3 = (int)uVar3 >> 1;
          auVar9 = auVar5;
          dVar13 = dVar13 * dVar13;
        } while (bVar2);
      }
      auVar6 = auVar11;
      auVar9 = auVar11;
      dVar13 = dVar7;
      if (uVar4 != 0) {
        do {
          auVar6._0_8_ = (ulong)((byte)uVar4 & 1) * (long)(dVar13 * auVar9._0_8_) +
                         (ulong)!(bool)((byte)uVar4 & 1) * (long)auVar9._0_8_;
          auVar6._8_8_ = auVar9._8_8_;
          bVar2 = 1 < uVar4;
          uVar4 = (int)uVar4 >> 1;
          auVar9 = auVar6;
          dVar13 = dVar13 * dVar13;
        } while (bVar2);
      }
      auVar9._8_8_ = 0;
      auVar9._0_8_ = auVar5._0_8_ * dVar8;
      auVar12 = vfmadd213sd_fma(auVar9,auVar6,auVar12);
      dVar8 = auVar12._0_8_;
      numReplaced = uVar1;
    } while (pathLength != uVar1);
  }
  return dVar8;
}

Assistant:

double ProbabEstimator::getProbabGt0( const double minValInRetained, const int numReplaced, const int pathLength ){

    double  PAr = distribFunction->getDistrib(minValInRetained);
    double cPAr = 1.0-PAr;

    double val = 0.0;
    for ( int i = numReplaced+1; i <= pathLength; ++i ){
        double val0 = (double)combNumber( pathLength, i )*pown( cPAr, i )*pown(PAr, (pathLength-i));
        val += val0;
    }

    return val;
}